

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Sector_SetCeilingScale2
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  FSectorTagIterator local_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  
  if (arg0 == 0) {
    local_50.start = 0;
  }
  else {
    local_50.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  local_50.searchtag = arg0;
  uVar1 = FSectorTagIterator::Next(&local_50);
  if (-1 < (int)uVar1) {
    dVar2 = (double)arg1 * 1.52587890625e-05;
    dVar3 = (double)arg2 * 1.52587890625e-05;
    local_48 = (double)(~-(ulong)(dVar2 != 0.0) & (ulong)dVar2 |
                       (ulong)(1.0 / dVar2) & -(ulong)(dVar2 != 0.0));
    uStack_40 = 0;
    local_38 = (double)(~-(ulong)(dVar3 != 0.0) & (ulong)dVar3 |
                       (ulong)(1.0 / dVar3) & -(ulong)(dVar3 != 0.0));
    do {
      if (arg1 != 0) {
        sectors[uVar1].planes[1].xform.xScale = local_48;
      }
      if (arg2 != 0) {
        sectors[uVar1].planes[1].xform.yScale = local_38;
      }
      uVar1 = FSectorTagIterator::Next(&local_50);
    } while (-1 < (int)uVar1);
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetCeilingScale2)
// Sector_SetFloorScale2 (tag, x-factor, y-factor)
{
	double xscale = arg1 / 65536., yscale = arg2 / 65536.;

	if (xscale)
		xscale = 1. / xscale;
	if (yscale)
		yscale = 1. / yscale;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		if (arg1)
			sectors[secnum].SetXScale(sector_t::ceiling, xscale);
		if (arg2)
			sectors[secnum].SetYScale(sector_t::ceiling, yscale);
	}
	return true;
}